

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O2

int ndn_forwarder_add_route(ndn_face_intf_t *face,uint8_t *prefix,size_t length)

{
  int iVar1;
  ndn_fib_entry_t *pnVar2;
  
  if (face != (ndn_face_intf_t *)0x0) {
    if (face->face_id < (forwarder.facetab)->capacity) {
      iVar1 = tlv_check_type_length(prefix,length,7);
      if (iVar1 == 0) {
        pnVar2 = ndn_fib_find_or_insert(forwarder.fib,prefix,length);
        if (pnVar2 == (ndn_fib_entry_t *)0x0) {
          iVar1 = -0x35;
        }
        else {
          pnVar2->nexthop = pnVar2->nexthop | 1L << ((byte)face->face_id & 0x3f);
          iVar1 = 0;
        }
      }
    }
    else {
      iVar1 = -0x36;
    }
    return iVar1;
  }
  return -0x10;
}

Assistant:

int
ndn_forwarder_add_route(ndn_face_intf_t* face, uint8_t* prefix, size_t length){
  int ret;
  ndn_fib_entry_t* fib_entry;

  if(face == NULL)
    return NDN_INVALID_POINTER;
  if(face->face_id >= forwarder.facetab->capacity)
    return NDN_FWD_INVALID_FACE;
  ret = tlv_check_type_length(prefix, length, TLV_Name);
  if(ret != NDN_SUCCESS)
    return ret;

  fib_entry = ndn_fib_find_or_insert(forwarder.fib, prefix, length);
  if (fib_entry == NULL)
    return NDN_FWD_FIB_FULL;
  fib_entry->nexthop = bitset_set(fib_entry->nexthop, face->face_id);
  return NDN_SUCCESS;
}